

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::tetrahedrondealloc(tetgenmesh *this,tetrahedron *dyingtetrahedron)

{
  tetrahedron ppdVar1;
  memorypool *pmVar2;
  
  dyingtetrahedron[4] = (tetrahedron)0x0;
  ppdVar1 = dyingtetrahedron[8];
  if (ppdVar1 != (tetrahedron)0x0) {
    pmVar2 = this->tet2segpool;
    *ppdVar1 = (double *)pmVar2->deaditemstack;
    pmVar2->deaditemstack = ppdVar1;
    pmVar2->items = pmVar2->items + -1;
  }
  ppdVar1 = dyingtetrahedron[9];
  if (ppdVar1 != (tetrahedron)0x0) {
    pmVar2 = this->tet2subpool;
    *ppdVar1 = (double *)pmVar2->deaditemstack;
    pmVar2->deaditemstack = ppdVar1;
    pmVar2->items = pmVar2->items + -1;
  }
  pmVar2 = this->tetrahedrons;
  *dyingtetrahedron = (tetrahedron)pmVar2->deaditemstack;
  pmVar2->deaditemstack = dyingtetrahedron;
  pmVar2->items = pmVar2->items + -1;
  return;
}

Assistant:

void tetgenmesh::tetrahedrondealloc(tetrahedron *dyingtetrahedron)
{
  // Set tetrahedron's vertices to NULL. This makes it possible to detect
  //   dead tetrahedra when traversing the list of all tetrahedra.
  dyingtetrahedron[4] = (tetrahedron) NULL;

  // Dealloc the space to subfaces/subsegments.
  if (dyingtetrahedron[8] != NULL) {
    tet2segpool->dealloc((shellface *) dyingtetrahedron[8]);
  }
  if (dyingtetrahedron[9] != NULL) {
    tet2subpool->dealloc((shellface *) dyingtetrahedron[9]);
  }

  tetrahedrons->dealloc((void *) dyingtetrahedron);
}